

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O1

void __thiscall
GraphTestCycleWithLengthZeroFromDepfile::Run(GraphTestCycleWithLengthZeroFromDepfile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Edge *pEVar3;
  Test *pTVar4;
  bool bVar5;
  int iVar6;
  Node *pNVar7;
  string err;
  string local_68;
  string local_48;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule deprule\n   depfile = dep.d\n   command = unused\nbuild a b: deprule\n",
              (ManifestParserOptions)0x0);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"dep.d","");
  paVar2 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a: b\n","");
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  pTVar4 = g_current_test;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
  pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_68);
  bVar5 = DependencyScan::RecomputeDirty
                    (&(this->super_GraphTest).scan_,pNVar7,
                     (vector<Node_*,_std::allocator<Node_*>_> *)0x0,&local_48);
  testing::Test::Check
            (pTVar4,!bVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc",
             0x1b2,"scan_.RecomputeDirty(GetNode(\"a\"), NULL, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pTVar4 = g_current_test;
  iVar6 = std::__cxx11::string::compare((char *)&local_48);
  bVar5 = testing::Test::Check
                    (pTVar4,iVar6 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                     ,0x1b3,"\"dependency cycle: b -> b\" == err");
  if (bVar5) {
    local_68._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
    pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_68);
    pEVar3 = pNVar7->in_edge_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    testing::Test::Check
              (g_current_test,
               (long)(pEVar3->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pEVar3->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start == 8,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x1b9,"1 == edge->inputs_.size()");
    pTVar4 = g_current_test;
    iVar6 = std::__cxx11::string::compare
                      ((char *)*(pEVar3->inputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
    testing::Test::Check
              (pTVar4,iVar6 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x1ba,"\"b\" == edge->inputs_[0]->path()");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(GraphTest, CycleWithLengthZeroFromDepfile) {
  AssertParse(&state_,
"rule deprule\n"
"   depfile = dep.d\n"
"   command = unused\n"
"build a b: deprule\n"
  );
  fs_.Create("dep.d", "a: b\n");

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("a"), NULL, &err));
  ASSERT_EQ("dependency cycle: b -> b", err);

  // Despite the depfile causing edge to be a cycle (it has outputs a and b,
  // but the depfile also adds b as an input), the deps should have been loaded
  // only once:
  Edge* edge = GetNode("a")->in_edge();
  EXPECT_EQ(1, edge->inputs_.size());
  EXPECT_EQ("b", edge->inputs_[0]->path());
}